

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

void Js::JavascriptOperators::IteratorClose(RecyclableObject *iterator,ScriptContext *scriptContext)

{
  anon_class_16_2_1e90eea3 implicitCall;
  bool bVar1;
  Var aValue;
  RecyclableObject *function;
  ThreadContext *this;
  JavascriptException *err;
  RecyclableObject *callable;
  Var func;
  ScriptContext *scriptContext_local;
  RecyclableObject *iterator_local;
  
  aValue = GetProperty(iterator,0x135,scriptContext,(PropertyValueInfo *)0x0);
  bVar1 = JavascriptConversion::IsCallable(aValue);
  if (bVar1) {
    function = VarTo<Js::RecyclableObject>(aValue);
    this = ScriptContext::GetThreadContext(scriptContext);
    implicitCall.callable = function;
    implicitCall.iterator = iterator;
    ThreadContext::
    ExecuteImplicitCall<Js::JavascriptOperators::IteratorClose(Js::RecyclableObject*,Js::ScriptContext*)::__0>
              (this,function,ImplicitCall_Accessor,implicitCall);
  }
  return;
}

Assistant:

void JavascriptOperators::IteratorClose(RecyclableObject* iterator, ScriptContext* scriptContext)
    {
        try
        {
            Var func = JavascriptOperators::GetProperty(iterator, PropertyIds::return_, scriptContext);

            if (JavascriptConversion::IsCallable(func))
            {
                RecyclableObject* callable = VarTo<RecyclableObject>(func);
                scriptContext->GetThreadContext()->ExecuteImplicitCall(callable, ImplicitCall_Accessor, [=]()->Var
                {
                    Js::Var args[] = { iterator };
                    Js::CallInfo callInfo(Js::CallFlags_Value, _countof(args));
                    return JavascriptFunction::CallFunction<true>(callable, callable->GetEntryPoint(), Js::Arguments(callInfo, args));
                });
            }
        }
        catch (const JavascriptException& err)
        {
            err.GetAndClear();  // discard exception object
            // We have arrived in this function due to AbruptCompletion (which is an exception), so we don't need to
            // propagate the exception of calling return function
        }
    }